

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteUInt64
               (int field_number,uint64 value,CodedOutputStream *output)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  uint uVar5;
  uint value_00;
  ulong uVar6;
  
  value_00 = field_number << 3;
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,value_00);
    iVar3 = output->buffer_size_;
  }
  else {
    pbVar1 = output->buffer_;
    pbVar4 = pbVar1;
    uVar5 = value_00;
    if (0x7f < value_00) {
      do {
        *pbVar4 = (byte)value_00 | 0x80;
        uVar5 = value_00 >> 7;
        pbVar4 = pbVar4 + 1;
        bVar2 = 0x3fff < value_00;
        value_00 = uVar5;
      } while (bVar2);
    }
    *pbVar4 = (byte)uVar5;
    iVar3 = ((int)pbVar4 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar3;
    iVar3 = output->buffer_size_ - iVar3;
    output->buffer_size_ = iVar3;
  }
  if (iVar3 < 10) {
    io::CodedOutputStream::WriteVarint64SlowPath(output,value);
    return;
  }
  pbVar1 = output->buffer_;
  pbVar4 = pbVar1;
  uVar6 = value;
  if (0x7f < value) {
    do {
      *pbVar4 = (byte)uVar6 | 0x80;
      value = uVar6 >> 7;
      pbVar4 = pbVar4 + 1;
      bVar2 = 0x3fff < uVar6;
      uVar6 = value;
    } while (bVar2);
  }
  *pbVar4 = (byte)value;
  iVar3 = ((int)pbVar4 - (int)pbVar1) + 1;
  output->buffer_ = output->buffer_ + iVar3;
  output->buffer_size_ = output->buffer_size_ - iVar3;
  return;
}

Assistant:

void WireFormatLite::WriteUInt64(int field_number, uint64 value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteUInt64NoTag(value, output);
}